

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

void __thiscall
Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>::create_expansion<false>
          (Simplex_tree<Simplex_tree_options_stable_simplex_handles> *this,Siblings *siblings,
          Dictionary_it *s_h,Dictionary_it *next,Filtration_value *fil,int k,
          vector<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_std::allocator<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>_>_>
          *added_simplices)

{
  long lVar1;
  bool bVar2;
  pointer ppVar3;
  Siblings *pSVar4;
  size_type sVar5;
  Simplex_tree_siblings<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>,_boost::container::map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>,_std::less<int>,_void,_void>_>
  *this_00;
  pointer ppVar6;
  long *in_FS_OFFSET;
  iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
  local_a0;
  undefined1 local_98 [16];
  iterator it;
  Siblings *new_sib;
  undefined1 local_68 [16];
  iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
  local_58;
  iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
  local_50;
  iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
  local_48;
  undefined1 local_40 [8];
  Simplex_handle root_sh;
  int k_local;
  Filtration_value *fil_local;
  Dictionary_it *next_local;
  Dictionary_it *s_h_local;
  Siblings *siblings_local;
  Simplex_tree<Simplex_tree_options_stable_simplex_handles> *this_local;
  
  root_sh.m_iit.members_.nodeptr_._4_4_ = k;
  boost::container::dtl::
  iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>
  ::operator->(s_h);
  find_vertex((Simplex_tree<Simplex_tree_options_stable_simplex_handles> *)local_40,
              (Vertex_handle)this);
  if ((char)in_FS_OFFSET[-1] == '\0') {
    lVar1 = *in_FS_OFFSET;
    std::
    vector<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_std::allocator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_>_>
    ::vector((vector<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_std::allocator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_>_>
              *)(lVar1 + -0x20));
    __cxa_thread_atexit(std::
                        vector<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_std::allocator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_>_>
                        ::~vector,
                        (vector<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_std::allocator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_>_>
                         *)(lVar1 + -0x20),&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -1) = 1;
  }
  boost::container::dtl::
  iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
  ::iterator_from_iiterator
            (&local_48,
             (iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
              *)local_40);
  bVar2 = has_children<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<int_const,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>>>,void*,(boost::container::tree_type_enum)0,true>,boost::intrusive::rbtree_node_traits<void*,true>,(boost::intrusive::link_mode_type)0,boost::intrusive::dft_tag,3u>,false>,true>>
                    (this,&local_48);
  if (bVar2) {
    lVar1 = *in_FS_OFFSET;
    boost::container::dtl::
    iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
    ::iterator_from_iiterator(&local_50,next);
    Simplex_tree_siblings<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>,_boost::container::map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>,_std::less<int>,_void,_void>_>
    ::members(siblings);
    boost::container::dtl::
    tree<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_int,_std::less<int>,_void,_void>
    ::end((tree<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_int,_std::less<int>,_void,_void>
           *)(local_68 + 8));
    boost::container::dtl::
    iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
    ::iterator_from_iiterator(&local_58,(nonconst_iterator *)(local_68 + 8));
    ppVar3 = boost::container::dtl::
             iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
             ::operator->((iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
                           *)local_40);
    pSVar4 = Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>
             ::children(&ppVar3->second);
    Simplex_tree_siblings<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>,_boost::container::map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>,_std::less<int>,_void,_void>_>
    ::members(pSVar4);
    boost::container::dtl::
    tree<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_int,_std::less<int>,_void,_void>
    ::begin((tree<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_int,_std::less<int>,_void,_void>
             *)local_68);
    ppVar3 = boost::container::dtl::
             iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
             ::operator->((iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
                           *)local_40);
    pSVar4 = Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>
             ::children(&ppVar3->second);
    Simplex_tree_siblings<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>,_boost::container::map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>,_std::less<int>,_void,_void>_>
    ::members(pSVar4);
    boost::container::dtl::
    tree<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_int,_std::less<int>,_void,_void>
    ::end((tree<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_int,_std::less<int>,_void,_void>
           *)&new_sib);
    intersection<false>((vector<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_std::allocator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_>_>
                         *)(lVar1 + -0x20),&local_50,&local_58,(Dictionary_const_it *)local_68,
                        (Dictionary_const_it *)&new_sib,fil);
    sVar5 = std::
            vector<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_std::allocator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_>_>
            ::size((vector<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_std::allocator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_>_>
                    *)(*in_FS_OFFSET + -0x20));
    if (sVar5 == 0) {
      ppVar6 = boost::container::dtl::
               iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>
               ::operator->(s_h);
      Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>
      ::assign_children(&ppVar6->second,siblings);
      std::
      vector<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_std::allocator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_>_>
      ::clear((vector<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_std::allocator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_>_>
               *)(*in_FS_OFFSET + -0x20));
    }
    else {
      this_00 = (Simplex_tree_siblings<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>,_boost::container::map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>,_std::less<int>,_void,_void>_>
                 *)operator_new(0x30);
      ppVar6 = boost::container::dtl::
               iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>
               ::operator->(s_h);
      Simplex_tree_siblings<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>,boost::container::map<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>>,std::less<int>,void,void>>
      ::
      Simplex_tree_siblings<std::vector<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>>>,std::allocator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>>>>>>
                ((Simplex_tree_siblings<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>,boost::container::map<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>>,std::less<int>,void,void>>
                  *)this_00,siblings,ppVar6->first,
                 (vector<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_std::allocator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_>_>
                  *)(*in_FS_OFFSET + -0x20));
      Simplex_tree_siblings<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>,_boost::container::map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>,_std::less<int>,_void,_void>_>
      ::members(this_00);
      boost::container::dtl::
      tree<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_int,_std::less<int>,_void,_void>
      ::begin((tree<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_int,_std::less<int>,_void,_void>
               *)(local_98 + 8));
      while( true ) {
        Simplex_tree_siblings<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>,_boost::container::map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>,_std::less<int>,_void,_void>_>
        ::members(this_00);
        boost::container::dtl::
        tree<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_int,_std::less<int>,_void,_void>
        ::end((tree<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_int,_std::less<int>,_void,_void>
               *)local_98);
        bVar2 = boost::container::dtl::operator!=
                          ((iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>
                            *)(local_98 + 8),
                           (iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>
                            *)local_98);
        if (!bVar2) break;
        boost::container::dtl::
        iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>
        ::iterator_from_iiterator(&local_a0,(nonconst_iterator *)(local_98 + 8));
        update_simplex_tree_after_node_insertion(this,&local_a0);
        boost::container::dtl::
        iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>
        ::operator++((iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>
                      *)(local_98 + 8));
      }
      std::
      vector<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_std::allocator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_>_>
      ::clear((vector<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_std::allocator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>_>_>
               *)(*in_FS_OFFSET + -0x20));
      ppVar6 = boost::container::dtl::
               iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>
               ::operator->(s_h);
      Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Simplex_tree_options_stable_simplex_handles>_>
      ::assign_children(&ppVar6->second,this_00);
      siblings_expansion(this,this_00,root_sh.m_iit.members_.nodeptr_._4_4_ + -1);
    }
  }
  return;
}

Assistant:

void create_expansion(Siblings * siblings,
                        Dictionary_it& s_h,
                        Dictionary_it& next,
                        const Filtration_value& fil,
                        int k,
                        std::vector<Simplex_handle>* added_simplices = nullptr)
  {
    Simplex_handle root_sh = find_vertex(s_h->first);
    thread_local std::vector<std::pair<Vertex_handle, Node> > inter;

    if (!has_children(root_sh)) return;

    intersection<force_filtration_value>(
          inter,  // output intersection
          next,   // begin
          siblings->members().end(),  // end
          root_sh->second.children()->members().begin(),
          root_sh->second.children()->members().end(),
          fil);
    if (inter.size() != 0) {
      Siblings * new_sib = new Siblings(siblings,   // oncles
                                        s_h->first, // parent
                                        inter);     // boost::container::ordered_unique_range_t
      for (auto it = new_sib->members().begin(); it != new_sib->members().end(); ++it) {
        update_simplex_tree_after_node_insertion(it);
        if constexpr (force_filtration_value){
          //the way create_expansion is used, added_simplices != nullptr when force_filtration_value == true
          added_simplices->push_back(it);
        }
      }
      inter.clear();
      s_h->second.assign_children(new_sib);
      if constexpr (force_filtration_value){
        siblings_expansion(new_sib, fil, k - 1, *added_simplices);
      } else {
        siblings_expansion(new_sib, k - 1);
      }
    } else {
      // ensure the children property
      s_h->second.assign_children(siblings);
      inter.clear();
    }
  }